

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlCtxtUseOptionsInternal(xmlParserCtxtPtr ctxt,int options,char *encoding)

{
  byte *pbVar1;
  _xmlSAXHandler *p_Var2;
  uint uVar3;
  xmlChar *pxVar4;
  bool bVar5;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    options = 0xffffffff;
  }
  else {
    if (encoding != (char *)0x0) {
      if (ctxt->encoding != (xmlChar *)0x0) {
        (*xmlFree)(ctxt->encoding);
      }
      pxVar4 = xmlStrdup((xmlChar *)encoding);
      ctxt->encoding = pxVar4;
    }
    uVar3 = 0;
    bVar5 = (options & 1U) != 0;
    if (bVar5) {
      options = options - 1;
      *(byte *)&ctxt->options = (byte)ctxt->options | 1;
    }
    ctxt->recovery = (uint)bVar5;
    if ((options & 4U) != 0) {
      options = options - 4;
      *(byte *)&ctxt->options = (byte)ctxt->options | 4;
      uVar3 = 2;
    }
    ctxt->loadsubset = uVar3;
    if ((options & 8U) != 0) {
      ctxt->loadsubset = uVar3 | 4;
      options = options - 8;
      *(byte *)&ctxt->options = (byte)ctxt->options | 8;
    }
    bVar5 = (options & 2U) != 0;
    if (bVar5) {
      options = options - 2;
      *(byte *)&ctxt->options = (byte)ctxt->options | 2;
    }
    ctxt->replaceEntities = (uint)bVar5;
    bVar5 = (char)options < '\0';
    if (bVar5) {
      options = options - 0x80;
      *(byte *)&ctxt->options = (byte)ctxt->options | 0x80;
    }
    ctxt->pedantic = (uint)bVar5;
    bVar5 = ((uint)options >> 8 & 1) == 0;
    if (!bVar5) {
      ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
      options = options - 0x100;
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    ctxt->keepBlanks = (uint)bVar5;
    if ((options & 0x10U) == 0) {
      ctxt->validate = 0;
    }
    else {
      ctxt->validate = 1;
      if ((options & 0x40U) != 0) {
        (ctxt->vctxt).warning = (xmlValidityWarningFunc)0x0;
      }
      if ((options & 0x20U) != 0) {
        (ctxt->vctxt).error = (xmlValidityErrorFunc)0x0;
      }
      options = options - 0x10;
      *(byte *)&ctxt->options = (byte)ctxt->options | 0x10;
    }
    if ((options & 0x40U) != 0) {
      ctxt->sax->warning = (warningSAXFunc)0x0;
      options = options - 0x40;
    }
    if ((options & 0x20U) != 0) {
      p_Var2 = ctxt->sax;
      options = options - 0x20;
      p_Var2->error = (errorSAXFunc)0x0;
      p_Var2->fatalError = (fatalErrorSAXFunc)0x0;
    }
    if (((uint)options >> 9 & 1) != 0) {
      p_Var2 = ctxt->sax;
      p_Var2->startElement = xmlSAX2StartElement;
      p_Var2->endElement = xmlSAX2EndElement;
      p_Var2->startElementNs = (startElementNsSAX2Func)0x0;
      p_Var2->endElementNs = (endElementNsSAX2Func)0x0;
      p_Var2->initialized = 1;
      options = options - 0x200;
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    bVar5 = ((uint)options >> 0xc & 1) == 0;
    if (!bVar5) {
      options = options - 0x1000;
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    ctxt->dictNames = (uint)bVar5;
    if (((uint)options >> 0xe & 1) != 0) {
      ctxt->sax->cdataBlock = (cdataBlockSAXFunc)0x0;
      options = options - 0x4000;
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    if (((uint)options >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 0x20;
      options = options - 0x2000;
    }
    if (((uint)options >> 0xb & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 8;
      options = options - 0x800;
    }
    if (((uint)options >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 1;
      options = options - 0x10000;
    }
    if (((uint)options >> 0x11 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 2;
      options = options - 0x20000;
    }
    if (((uint)options >> 0x12 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 4;
      options = options - 0x40000;
    }
    if (((uint)options >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 8;
      options = options - 0x80000;
      if (ctxt->dict != (xmlDictPtr)0x0) {
        xmlDictSetLimit(ctxt->dict,0);
      }
    }
    if (((uint)options >> 0x14 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 0x10;
      options = options - 0x100000;
    }
    if (((uint)options >> 0x15 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 0x20;
      options = options - 0x200000;
    }
    if (((uint)options >> 0x16 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 0x40;
      options = options - 0x400000;
    }
    if (((uint)options >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 0x80;
      options = options - 0x800000;
    }
    if (((uint)options >> 0x18 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 3);
      *pbVar1 = *pbVar1 | 1;
      options = options - 0x1000000;
    }
    ctxt->linenumbers = 1;
  }
  return options;
}

Assistant:

static int
xmlCtxtUseOptionsInternal(xmlParserCtxtPtr ctxt, int options, const char *encoding)
{
    if (ctxt == NULL)
        return(-1);
    if (encoding != NULL) {
        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) encoding);
    }
    if (options & XML_PARSE_RECOVER) {
        ctxt->recovery = 1;
        options -= XML_PARSE_RECOVER;
	ctxt->options |= XML_PARSE_RECOVER;
    } else
        ctxt->recovery = 0;
    if (options & XML_PARSE_DTDLOAD) {
        ctxt->loadsubset = XML_DETECT_IDS;
        options -= XML_PARSE_DTDLOAD;
	ctxt->options |= XML_PARSE_DTDLOAD;
    } else
        ctxt->loadsubset = 0;
    if (options & XML_PARSE_DTDATTR) {
        ctxt->loadsubset |= XML_COMPLETE_ATTRS;
        options -= XML_PARSE_DTDATTR;
	ctxt->options |= XML_PARSE_DTDATTR;
    }
    if (options & XML_PARSE_NOENT) {
        ctxt->replaceEntities = 1;
        /* ctxt->loadsubset |= XML_DETECT_IDS; */
        options -= XML_PARSE_NOENT;
	ctxt->options |= XML_PARSE_NOENT;
    } else
        ctxt->replaceEntities = 0;
    if (options & XML_PARSE_PEDANTIC) {
        ctxt->pedantic = 1;
        options -= XML_PARSE_PEDANTIC;
	ctxt->options |= XML_PARSE_PEDANTIC;
    } else
        ctxt->pedantic = 0;
    if (options & XML_PARSE_NOBLANKS) {
        ctxt->keepBlanks = 0;
        ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
        options -= XML_PARSE_NOBLANKS;
	ctxt->options |= XML_PARSE_NOBLANKS;
    } else
        ctxt->keepBlanks = 1;
    if (options & XML_PARSE_DTDVALID) {
        ctxt->validate = 1;
        if (options & XML_PARSE_NOWARNING)
            ctxt->vctxt.warning = NULL;
        if (options & XML_PARSE_NOERROR)
            ctxt->vctxt.error = NULL;
        options -= XML_PARSE_DTDVALID;
	ctxt->options |= XML_PARSE_DTDVALID;
    } else
        ctxt->validate = 0;
    if (options & XML_PARSE_NOWARNING) {
        ctxt->sax->warning = NULL;
        options -= XML_PARSE_NOWARNING;
    }
    if (options & XML_PARSE_NOERROR) {
        ctxt->sax->error = NULL;
        ctxt->sax->fatalError = NULL;
        options -= XML_PARSE_NOERROR;
    }
#ifdef LIBXML_SAX1_ENABLED
    if (options & XML_PARSE_SAX1) {
        ctxt->sax->startElement = xmlSAX2StartElement;
        ctxt->sax->endElement = xmlSAX2EndElement;
        ctxt->sax->startElementNs = NULL;
        ctxt->sax->endElementNs = NULL;
        ctxt->sax->initialized = 1;
        options -= XML_PARSE_SAX1;
	ctxt->options |= XML_PARSE_SAX1;
    }
#endif /* LIBXML_SAX1_ENABLED */
    if (options & XML_PARSE_NODICT) {
        ctxt->dictNames = 0;
        options -= XML_PARSE_NODICT;
	ctxt->options |= XML_PARSE_NODICT;
    } else {
        ctxt->dictNames = 1;
    }
    if (options & XML_PARSE_NOCDATA) {
        ctxt->sax->cdataBlock = NULL;
        options -= XML_PARSE_NOCDATA;
	ctxt->options |= XML_PARSE_NOCDATA;
    }
    if (options & XML_PARSE_NSCLEAN) {
	ctxt->options |= XML_PARSE_NSCLEAN;
        options -= XML_PARSE_NSCLEAN;
    }
    if (options & XML_PARSE_NONET) {
	ctxt->options |= XML_PARSE_NONET;
        options -= XML_PARSE_NONET;
    }
    if (options & XML_PARSE_COMPACT) {
	ctxt->options |= XML_PARSE_COMPACT;
        options -= XML_PARSE_COMPACT;
    }
    if (options & XML_PARSE_OLD10) {
	ctxt->options |= XML_PARSE_OLD10;
        options -= XML_PARSE_OLD10;
    }
    if (options & XML_PARSE_NOBASEFIX) {
	ctxt->options |= XML_PARSE_NOBASEFIX;
        options -= XML_PARSE_NOBASEFIX;
    }
    if (options & XML_PARSE_HUGE) {
	ctxt->options |= XML_PARSE_HUGE;
        options -= XML_PARSE_HUGE;
        if (ctxt->dict != NULL)
            xmlDictSetLimit(ctxt->dict, 0);
    }
    if (options & XML_PARSE_OLDSAX) {
	ctxt->options |= XML_PARSE_OLDSAX;
        options -= XML_PARSE_OLDSAX;
    }
    if (options & XML_PARSE_IGNORE_ENC) {
	ctxt->options |= XML_PARSE_IGNORE_ENC;
        options -= XML_PARSE_IGNORE_ENC;
    }
    if (options & XML_PARSE_BIG_LINES) {
	ctxt->options |= XML_PARSE_BIG_LINES;
        options -= XML_PARSE_BIG_LINES;
    }
    if (options & XML_PARSE_DETECT_ML) {
	ctxt->options |= XML_PARSE_DETECT_ML;
        options -= XML_PARSE_DETECT_ML;
    }
    if (options & XML_PARSE_SML) {
	ctxt->options |= XML_PARSE_SML;
        options -= XML_PARSE_SML;
    }
    ctxt->linenumbers = 1;
    return (options);
}